

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O2

int evmap_io_add_(event_base *base,int fd,event *ev)

{
  event_signal_map *map;
  ushort uVar1;
  ushort uVar2;
  eventop *peVar3;
  undefined8 *puVar4;
  event *peVar5;
  bool bVar6;
  ushort uVar7;
  byte bVar8;
  int iVar9;
  void *pvVar10;
  ushort uVar11;
  char *fmt;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  event **ppeVar15;
  uint uVar16;
  
  if (ev->ev_fd != fd) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evmap.c"
               ,0x11a,"fd == ev->ev_fd","evmap_io_add_");
  }
  if (-1 < fd) {
    peVar3 = base->evsel;
    map = &base->io;
    if ((fd < (base->io).nentries) || (iVar9 = evmap_make_space(map,fd,(int)ev), iVar9 != -1)) {
      ppeVar15 = (event **)map->entries[(uint)fd];
      if (ppeVar15 == (event **)0x0) {
        pvVar10 = event_mm_calloc_(1,peVar3->fdinfo_len + 0x10);
        map->entries[(uint)fd] = pvVar10;
        puVar4 = (undefined8 *)map->entries[(uint)fd];
        if (puVar4 == (undefined8 *)0x0) {
          return -1;
        }
        *(undefined8 *)((long)puVar4 + 6) = 0;
        *puVar4 = 0;
        ppeVar15 = (event **)map->entries[(uint)fd];
      }
      uVar11 = *(ushort *)(ppeVar15 + 1);
      bVar6 = uVar11 != 0;
      uVar1 = *(ushort *)((long)ppeVar15 + 10);
      uVar2 = ev->ev_events;
      uVar13 = uVar2 & 2;
      uVar14 = (uint)(uVar11 == 0) * 2;
      if ((uVar2 & 2) == 0) {
        uVar14 = uVar13;
      }
      uVar7 = (ushort)uVar14;
      bVar8 = bVar6 * '\x02' + 4;
      if (uVar1 == 0) {
        bVar8 = bVar6 * '\x02';
      }
      uVar12 = uVar7 + 4;
      if (uVar1 != 0) {
        uVar12 = uVar7;
      }
      uVar14 = (uVar13 >> 1) + (uint)uVar11;
      if ((uVar2 & 4) == 0) {
        uVar12 = uVar7;
      }
      uVar11 = uVar12 | 0x80;
      if (*(ushort *)((long)ppeVar15 + 0xc) != 0) {
        uVar11 = uVar12;
        bVar8 = bVar8 | 0x80;
      }
      if ((uVar2 & 0x80) == 0) {
        uVar11 = uVar12;
      }
      if (((uVar14 < 0x10000) && (uVar13 = ((uVar2 & 4) >> 2) + (uint)uVar1, uVar13 < 0x10000)) &&
         (uVar16 = ((uVar2 & 0x80) >> 7) + (uint)*(ushort *)((long)ppeVar15 + 0xc), uVar16 < 0x10000
         )) {
        if (((event_debug_mode_on_ == 0) || (*ppeVar15 == (event *)0x0)) ||
           ((((*ppeVar15)->ev_events ^ uVar2) & 0x20) == 0)) {
          if (uVar11 == 0) {
            iVar9 = 0;
          }
          else {
            iVar9 = (*peVar3->add)(base,ev->ev_fd,(short)bVar8,uVar11 | uVar2 & 0x20,ppeVar15 + 2);
            if (iVar9 == -1) {
              return -1;
            }
            iVar9 = 1;
          }
          *(short *)(ppeVar15 + 1) = (short)uVar14;
          *(short *)((long)ppeVar15 + 10) = (short)uVar13;
          *(short *)((long)ppeVar15 + 0xc) = (short)uVar16;
          peVar5 = *ppeVar15;
          (ev->ev_).ev_io.ev_io_next.le_next = peVar5;
          if (peVar5 != (event *)0x0) {
            (peVar5->ev_).ev_io.ev_io_next.le_prev = (event **)&ev->ev_;
          }
          *ppeVar15 = ev;
          (ev->ev_).ev_io.ev_io_next.le_prev = ppeVar15;
          return iVar9;
        }
        fmt = "Tried to mix edge-triggered and non-edge-triggered events on fd %d";
      }
      else {
        fmt = "Too many events reading or writing on fd %d";
      }
      event_warnx(fmt,(ulong)(uint)fd);
    }
    return -1;
  }
  return 0;
}

Assistant:

int
evmap_io_add_(struct event_base *base, evutil_socket_t fd, struct event *ev)
{
	const struct eventop *evsel = base->evsel;
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx = NULL;
	int nread, nwrite, nclose, retval = 0;
	short res = 0, old = 0;
	struct event *old_ev;

	EVUTIL_ASSERT(fd == ev->ev_fd);

	if (fd < 0)
		return 0;

#ifndef EVMAP_USE_HT
	if (fd >= io->nentries) {
		if (evmap_make_space(io, fd, sizeof(struct evmap_io *)) == -1)
			return (-1);
	}
#endif
	GET_IO_SLOT_AND_CTOR(ctx, io, fd, evmap_io, evmap_io_init,
						 evsel->fdinfo_len);

	nread = ctx->nread;
	nwrite = ctx->nwrite;
	nclose = ctx->nclose;

	if (nread)
		old |= EV_READ;
	if (nwrite)
		old |= EV_WRITE;
	if (nclose)
		old |= EV_CLOSED;

	if (ev->ev_events & EV_READ) {
		if (++nread == 1)
			res |= EV_READ;
	}
	if (ev->ev_events & EV_WRITE) {
		if (++nwrite == 1)
			res |= EV_WRITE;
	}
	if (ev->ev_events & EV_CLOSED) {
		if (++nclose == 1)
			res |= EV_CLOSED;
	}
	if (EVUTIL_UNLIKELY(nread > 0xffff || nwrite > 0xffff || nclose > 0xffff)) {
		event_warnx("Too many events reading or writing on fd %d",
		    (int)fd);
		return -1;
	}
	if (EVENT_DEBUG_MODE_IS_ON() &&
	    (old_ev = LIST_FIRST(&ctx->events)) &&
	    (old_ev->ev_events&EV_ET) != (ev->ev_events&EV_ET)) {
		event_warnx("Tried to mix edge-triggered and non-edge-triggered"
		    " events on fd %d", (int)fd);
		return -1;
	}

	if (res) {
		void *extra = ((char*)ctx) + sizeof(struct evmap_io);
		/* XXX(niels): we cannot mix edge-triggered and
		 * level-triggered, we should probably assert on
		 * this. */
		if (evsel->add(base, ev->ev_fd,
			old, (ev->ev_events & EV_ET) | res, extra) == -1)
			return (-1);
		retval = 1;
	}

	ctx->nread = (ev_uint16_t) nread;
	ctx->nwrite = (ev_uint16_t) nwrite;
	ctx->nclose = (ev_uint16_t) nclose;
	LIST_INSERT_HEAD(&ctx->events, ev, ev_io_next);

	return (retval);
}